

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall TArray<GLWall,_GLWall>::Push(TArray<GLWall,_GLWall> *this,GLWall *item)

{
  double *pdVar1;
  uint uVar2;
  GLWall *pGVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  seg_t *psVar7;
  GLWall *pGVar8;
  uint uVar9;
  
  Grow(this,1);
  pGVar3 = this->Array;
  uVar2 = this->Count;
  memcpy(pGVar3 + uVar2,item,200);
  pGVar3[uVar2].topplane.normal.X = (item->topplane).normal.X;
  pGVar3[uVar2].topplane.normal.Y = (item->topplane).normal.Y;
  pGVar3[uVar2].topplane.normal.Z = (item->topplane).normal.Z;
  dVar4 = (item->topplane).negiC;
  pdVar1 = &pGVar3[uVar2].topplane.D;
  *pdVar1 = (item->topplane).D;
  pdVar1[1] = dVar4;
  pGVar3[uVar2].bottomplane.normal.X = (item->bottomplane).normal.X;
  pGVar3[uVar2].bottomplane.normal.Y = (item->bottomplane).normal.Y;
  pGVar3[uVar2].bottomplane.normal.Z = (item->bottomplane).normal.Z;
  dVar4 = (item->bottomplane).negiC;
  pdVar1 = &pGVar3[uVar2].bottomplane.D;
  *pdVar1 = (item->bottomplane).D;
  pdVar1[1] = dVar4;
  pGVar3[uVar2].sub = item->sub;
  uVar5 = *(undefined8 *)item->zceil;
  uVar6 = *(undefined8 *)item->zfloor;
  uVar9 = item->vertcount;
  psVar7 = item->seg;
  pGVar8 = pGVar3 + uVar2;
  pGVar8->vertindex = item->vertindex;
  pGVar8->vertcount = uVar9;
  *(seg_t **)(&pGVar8->vertindex + 2) = psVar7;
  *(undefined8 *)pGVar3[uVar2].zceil = uVar5;
  *(undefined8 *)(pGVar3[uVar2].zceil + 2) = uVar6;
  uVar2 = this->Count;
  this->Count = uVar2 + 1;
  return uVar2;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}